

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.h
# Opt level: O2

bool __thiscall llvm::Twine::isValid(Twine *this)

{
  NodeKind NVar1;
  NodeKind NVar2;
  
  NVar1 = this->LHSKind;
  NVar2 = this->RHSKind;
  if ((NVar2 != EmptyKind && NVar1 < TwineKind) || (NVar2 == NullKind)) {
    return false;
  }
  if (NVar2 == EmptyKind) {
    if (NVar1 != TwineKind) {
      return true;
    }
  }
  else {
    if (NVar1 == EmptyKind) {
      return false;
    }
    if (NVar1 != TwineKind) goto LAB_00cd43f5;
  }
  if (((this->LHS).twine)->LHSKind == NullKind) {
    return false;
  }
  if (((this->LHS).twine)->RHSKind == EmptyKind) {
    return false;
  }
LAB_00cd43f5:
  if (NVar2 == TwineKind) {
    if (((this->RHS).twine)->LHSKind == NullKind) {
      return false;
    }
    if (((this->RHS).twine)->RHSKind == EmptyKind) {
      return false;
    }
  }
  return true;
}

Assistant:

bool isValid() const {
      // Nullary twines always have Empty on the RHS.
      if (isNullary() && getRHSKind() != EmptyKind)
        return false;

      // Null should never appear on the RHS.
      if (getRHSKind() == NullKind)
        return false;

      // The RHS cannot be non-empty if the LHS is empty.
      if (getRHSKind() != EmptyKind && getLHSKind() == EmptyKind)
        return false;

      // A twine child should always be binary.
      if (getLHSKind() == TwineKind &&
          !LHS.twine->isBinary())
        return false;
      if (getRHSKind() == TwineKind &&
          !RHS.twine->isBinary())
        return false;

      return true;
    }